

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O2

Stream * rw::readNativeData(Stream *stream,int32 len,void *object,int32 o,int32 s)

{
  uint32 uVar1;
  uint32 uVar2;
  ChunkHeaderInfo header;
  
  (*stream->_vptr_Stream[5])(stream,0xfffffffffffffffc,1);
  uVar1 = Stream::readU32(stream);
  readChunkHeaderInfo(stream,&header);
  if ((header.type == 1) && (uVar2 = libraryIDPack(header.version,header.build), uVar2 == uVar1)) {
    uVar1 = Stream::readU32(stream);
    (*stream->_vptr_Stream[5])(stream,0xfffffffffffffff0,1);
    switch(uVar1) {
    case 4:
      stream = ps2::readNativeData(stream,len,object,o,s);
      break;
    case 5:
      stream = xbox::readNativeData(stream,len,object,o,s);
      break;
    default:
      fprintf(_stderr,"unknown platform %d\n",(ulong)uVar1);
      (*stream->_vptr_Stream[5])(stream,len,1);
      break;
    case 8:
      stream = d3d8::readNativeData(stream,len,object,o,s);
      break;
    case 9:
      stream = d3d9::readNativeData(stream,len,object,o,s);
    }
  }
  else {
    (*stream->_vptr_Stream[5])(stream,0xfffffffffffffff4,1);
    wdgl::readNativeData(stream,len,object,o,s);
  }
  return stream;
}

Assistant:

static Stream*
readNativeData(Stream *stream, int32 len, void *object, int32 o, int32 s)
{
	ChunkHeaderInfo header;
	uint32 libid;
	uint32 platform;
	// ugly hack to find out platform
	stream->seek(-4);
	libid = stream->readU32();
	readChunkHeaderInfo(stream, &header);
	if(header.type == ID_STRUCT &&
	   libraryIDPack(header.version, header.build) == libid){
		platform = stream->readU32();
		stream->seek(-16);
		if(platform == PLATFORM_PS2)
			return ps2::readNativeData(stream, len, object, o, s);
		else if(platform == PLATFORM_XBOX)
			return xbox::readNativeData(stream, len, object, o, s);
		else if(platform == PLATFORM_D3D8)
			return d3d8::readNativeData(stream, len, object, o, s);
		else if(platform == PLATFORM_D3D9)
			return d3d9::readNativeData(stream, len, object, o, s);
		else{
			fprintf(stderr, "unknown platform %d\n", platform);
			stream->seek(len);
		}
	}else{
		stream->seek(-12);
		wdgl::readNativeData(stream, len, object, o, s);
	}
	return stream;
}